

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uloc_tag.cpp
# Opt level: O3

int32_t uloc_toLanguageTag_63
                  (char *localeID,char *langtag,int32_t langtagCapacity,UBool strict,
                  UErrorCode *status)

{
  int destCapacity;
  char cVar1;
  char cVar2;
  UBool UVar3;
  uint uVar4;
  int32_t iVar5;
  int32_t iVar6;
  UErrorCode UVar7;
  size_t sVar8;
  char *pcVar9;
  UEnumeration *en;
  size_t sVar10;
  VariantListEntry *var;
  AttributeListEntry *pAVar11;
  char *pcVar12;
  CharString *pCVar13;
  ExtensionListEntry *pEVar14;
  long lVar15;
  char *pcVar16;
  ulong uVar17;
  int iVar18;
  size_t s;
  ExtensionListEntry *pEVar19;
  char *s_00;
  int iVar20;
  char (*__s2) [3];
  int iVar21;
  char (*__s) [4];
  ulong uVar22;
  AttributeListEntry *pAVar23;
  bool bVar24;
  UErrorCode tmpStatus;
  UErrorCode tmpStatus_2;
  int32_t resultCapacity;
  int32_t resultCapacity_1;
  ExtensionListEntry *firstExt;
  AttributeListEntry *firstAttr;
  UErrorCode tmpStatus_1;
  int32_t len;
  CharString canonical;
  char buf [100];
  UErrorCode local_264;
  char *local_260;
  UErrorCode local_254;
  AttributeListEntry *local_250;
  char *local_248;
  char *local_240;
  ulong local_238;
  char *local_230;
  uint local_228;
  int32_t local_224;
  UEnumeration *local_220;
  ExtensionListEntry *local_218;
  AttributeListEntry *local_210;
  int local_204;
  char *local_200;
  long local_1f8;
  CharStringPool local_1f0;
  int32_t local_1bc;
  CharString local_1b8 [2];
  CharString local_118;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined4 local_78;
  
  local_230 = langtag;
  icu_63::MaybeStackArray<char,_40>::MaybeStackArray(&local_118.buffer);
  local_118.len = 0;
  *local_118.buffer.ptr = '\0';
  local_264 = U_ZERO_ERROR;
  sVar8 = strlen(localeID);
  local_228 = (uint)sVar8;
  if (0 < (int)local_228) {
    while (pcVar9 = icu_63::CharString::getAppendBuffer
                              (&local_118,(int32_t)sVar8,(int32_t)sVar8,(int32_t *)&local_228,
                               &local_264), local_264 < U_ILLEGAL_ARGUMENT_ERROR) {
      uVar4 = uloc_canonicalize_63(localeID,pcVar9,local_228,&local_264);
      sVar8 = (size_t)uVar4;
      if (local_264 != U_BUFFER_OVERFLOW_ERROR) {
        if (U_ZERO_ERROR < local_264) {
          *status = U_ILLEGAL_ARGUMENT_ERROR;
          goto LAB_002b2e74;
        }
        icu_63::CharString::append(&local_118,pcVar9,uVar4,&local_264);
        if (local_264 == U_STRING_NOT_TERMINATED_WARNING) {
          local_264 = U_ZERO_ERROR;
          goto LAB_002b2e7b;
        }
        if (local_264 < U_ILLEGAL_ARGUMENT_ERROR) goto LAB_002b2e7b;
        break;
      }
      local_264 = U_ZERO_ERROR;
      local_228 = uVar4;
    }
    *status = local_264;
LAB_002b2e74:
    iVar21 = 0;
    goto LAB_002b40a1;
  }
LAB_002b2e7b:
  pcVar9 = locale_getKeywordsStart_63(local_118.buffer.ptr);
  iVar21 = 0;
  if ((pcVar9 == local_118.buffer.ptr) &&
     (en = uloc_openKeywords_63(local_118.buffer.ptr,&local_264), en != (UEnumeration *)0x0)) {
    iVar5 = uenum_count_63(en,&local_264);
    if (iVar5 == 1) {
      local_1b8[0].buffer.ptr = (char *)((ulong)local_1b8[0].buffer.ptr & 0xffffffff00000000);
      pcVar9 = uenum_next_63(en,(int32_t *)local_1b8,&local_264);
      bVar24 = true;
      iVar21 = 0;
      if (((int)local_1b8[0].buffer.ptr == 1) && (*pcVar9 == 'x')) {
        local_d8 = CONCAT62(local_d8._2_6_,0x2d78);
        iVar5 = uloc_getKeywordValue_63
                          (localeID,pcVar9,(char *)((long)&local_d8 + 2),0x62,&local_264);
        local_1b8[0].buffer.ptr = (char *)CONCAT44(local_1b8[0].buffer.ptr._4_4_,iVar5);
        if (local_264 < U_ILLEGAL_ARGUMENT_ERROR) {
          UVar3 = _isPrivateuseValueSubtags((char *)((long)&local_d8 + 2),iVar5);
          if (UVar3 == '\0') {
            if (strict == '\0') goto LAB_002b40dd;
            goto LAB_002b2fdf;
          }
          iVar21 = (int)local_1b8[0].buffer.ptr + 2;
          iVar5 = uprv_min_63(iVar21,langtagCapacity);
          pcVar9 = local_230;
          memcpy(local_230,&local_d8,(long)iVar5);
          u_terminateChars_63(pcVar9,langtagCapacity,iVar21,status);
        }
        else {
LAB_002b2fdf:
          *status = U_ILLEGAL_ARGUMENT_ERROR;
          iVar21 = 0;
        }
        bVar24 = false;
      }
    }
    else {
LAB_002b40dd:
      bVar24 = true;
      iVar21 = 0;
    }
    uenum_close_63(en);
    if (!bVar24) goto LAB_002b40a1;
  }
  local_1b8[0].buffer.ptr = (char *)((ulong)local_1b8[0].buffer.ptr & 0xffffffff00000000);
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    iVar5 = uloc_getLanguage_63(local_118.buffer.ptr,(char *)&local_d8,0xc,(UErrorCode *)local_1b8);
    if ((int)local_1b8[0].buffer.ptr < 1 && (int)local_1b8[0].buffer.ptr != -0x7c) {
      if (iVar5 == 0) goto LAB_002b312a;
      UVar3 = _isLanguageSubtag((char *)&local_d8,iVar5);
      if (UVar3 == '\0') goto LAB_002b3023;
      pcVar9 = (char *)&local_d8;
      sVar8 = strlen(pcVar9);
      __s = DEPRECATEDLANGS;
      uVar22 = 0xfffffffffffffffe;
      do {
        sVar10 = strlen(*__s);
        if (sVar8 < sVar10) break;
        iVar18 = strcmp(pcVar9,*__s);
        if (iVar18 == 0) {
          strcpy((char *)&local_d8,__s[1]);
          sVar8 = strlen((char *)&local_d8);
          iVar5 = (int32_t)sVar8;
          break;
        }
        __s = __s + 2;
        uVar22 = uVar22 + 2;
      } while (uVar22 < 0x9a);
      if (0 < langtagCapacity) goto LAB_002b3438;
    }
    else {
LAB_002b3023:
      if (strict != '\0') {
        *status = U_ILLEGAL_ARGUMENT_ERROR;
        goto LAB_002b2ebb;
      }
LAB_002b312a:
      iVar5 = 3;
      if (0 < langtagCapacity) {
        pcVar9 = "und";
        iVar5 = 3;
LAB_002b3438:
        iVar6 = uprv_min_63(iVar5,langtagCapacity);
        memcpy(local_230,pcVar9,(long)iVar6);
      }
    }
    u_terminateChars_63(local_230,langtagCapacity,iVar5,status);
    iVar21 = iVar5 + iVar21;
    iVar5 = 0;
    local_1b8[0].buffer.ptr = (char *)((ulong)local_1b8[0].buffer.ptr & 0xffffffff00000000);
    if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
      iVar5 = uloc_getScript_63(local_118.buffer.ptr,(char *)&local_d8,6,(UErrorCode *)local_1b8);
      if ((int)local_1b8[0].buffer.ptr < 1 && (int)local_1b8[0].buffer.ptr != -0x7c) {
        pcVar9 = local_230 + iVar21;
        iVar18 = langtagCapacity - iVar21;
        if (iVar5 < 1) {
          iVar5 = 0;
        }
        else {
          UVar3 = _isScriptSubtag((char *)&local_d8,iVar5);
          if (UVar3 == '\0') goto LAB_002b34c1;
          if ((0 < iVar18) && (*pcVar9 = '-', iVar18 != 1)) {
            iVar6 = uprv_min_63(iVar5,iVar18 + -1);
            memcpy(pcVar9 + 1,&local_d8,(long)iVar6);
          }
          iVar5 = iVar5 + 1;
        }
        u_terminateChars_63(pcVar9,iVar18,iVar5,status);
      }
      else {
LAB_002b34c1:
        iVar5 = 0;
        if (strict != '\0') {
          *status = U_ILLEGAL_ARGUMENT_ERROR;
        }
      }
    }
  }
  else {
LAB_002b2ebb:
    iVar5 = 0;
  }
  iVar21 = iVar21 + iVar5;
  local_1b8[0].buffer.ptr = (char *)((ulong)local_1b8[0].buffer.ptr & 0xffffffff00000000);
  iVar18 = 0;
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    iVar5 = uloc_getCountry_63(local_118.buffer.ptr,(char *)&local_d8,4,(UErrorCode *)local_1b8);
    if ((int)local_1b8[0].buffer.ptr < 1 && (int)local_1b8[0].buffer.ptr != -0x7c) {
      pcVar9 = local_230 + iVar21;
      uVar4 = langtagCapacity - iVar21;
      if (iVar5 < 1) {
        iVar18 = 0;
      }
      else {
        UVar3 = _isRegionSubtag((char *)&local_d8,iVar5);
        if (UVar3 == '\0') {
          if (strict != '\0') goto LAB_002b2f32;
          goto LAB_002b2f3c;
        }
        if (0 < (int)uVar4) {
          *pcVar9 = '-';
        }
        __s2 = DEPRECATEDREGIONS;
        uVar22 = 0xfffffffffffffffe;
        local_260 = pcVar9;
        local_248 = (char *)(ulong)uVar4;
        do {
          iVar18 = strcmp((char *)&local_d8,*__s2);
          if (iVar18 == 0) {
            strcpy((char *)&local_d8,__s2[1]);
            sVar8 = strlen((char *)&local_d8);
            iVar5 = (int32_t)sVar8;
            break;
          }
          __s2 = __s2 + 2;
          uVar22 = uVar22 + 2;
        } while (uVar22 < 10);
        pcVar9 = local_260;
        uVar4 = (uint)local_248;
        if (1 < (int)uVar4) {
          iVar6 = uprv_min_63(iVar5,uVar4 - 1);
          memcpy(pcVar9 + 1,&local_d8,(long)iVar6);
        }
        iVar18 = iVar5 + 1;
      }
      u_terminateChars_63(pcVar9,uVar4,iVar18,status);
    }
    else {
      iVar18 = 0;
      if (strict != '\0') {
LAB_002b2f32:
        *status = U_ILLEGAL_ARGUMENT_ERROR;
LAB_002b2f3c:
        iVar18 = 0;
      }
    }
  }
  iVar18 = iVar18 + iVar21;
  local_1f0.status = U_ZERO_ERROR;
  local_238 = 0;
  local_204 = 0;
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    pcVar9 = (char *)&local_d8;
    iVar5 = uloc_getVariant_63(local_118.buffer.ptr,pcVar9,0x9d,&local_1f0.status);
    if (local_1f0.status < U_ILLEGAL_ARGUMENT_ERROR &&
        local_1f0.status != U_STRING_NOT_TERMINATED_WARNING) {
      local_248 = local_230 + iVar18;
      local_260 = (char *)CONCAT44(local_260._4_4_,langtagCapacity - iVar18);
      if (iVar5 < 1) {
        local_238 = 0;
        iVar5 = 0;
      }
      else {
        local_1b8[0].buffer.ptr = (char *)0x0;
        local_238 = 0;
        pcVar12 = (char *)0x0;
        do {
          cVar1 = *pcVar9;
          if (cVar1 == '\0') {
LAB_002b32a3:
            if (pcVar12 == (char *)0x0) {
LAB_002b3323:
              if (strict != '\0') {
LAB_002b3405:
                UVar7 = U_ILLEGAL_ARGUMENT_ERROR;
LAB_002b35c0:
                *status = UVar7;
                iVar5 = 0;
                pcVar9 = local_1b8[0].buffer.ptr;
                goto LAB_002b35d1;
              }
            }
            else {
              cVar2 = *pcVar12;
              pcVar16 = pcVar12;
              while (cVar2 != '\0') {
                cVar2 = uprv_asciitolower_63(cVar2);
                *pcVar16 = cVar2;
                cVar2 = pcVar16[1];
                pcVar16 = pcVar16 + 1;
              }
              UVar3 = _isVariantSubtag(pcVar12,-1);
              if (UVar3 == '\0') {
                if (strict != '\0') goto LAB_002b3405;
                UVar3 = _isPrivateuseValueSubtag(pcVar12,-1);
                if (UVar3 != '\0') break;
              }
              else {
                iVar21 = strcmp(pcVar12,"posix");
                if (iVar21 == 0 && iVar5 == 5) {
                  local_238 = 1;
                }
                else {
                  var = (VariantListEntry *)uprv_malloc_63(0x10);
                  if (var == (VariantListEntry *)0x0) {
                    UVar7 = U_MEMORY_ALLOCATION_ERROR;
                    goto LAB_002b35c0;
                  }
                  var->variant = pcVar12;
                  UVar3 = _addVariantToList((VariantListEntry **)local_1b8,var);
                  if (UVar3 == '\0') {
                    uprv_free_63(var);
                    goto LAB_002b3323;
                  }
                }
              }
            }
            pcVar12 = (char *)0x0;
          }
          else {
            if ((cVar1 == '_') || (cVar1 == '-')) {
              *pcVar9 = '\0';
              cVar1 = '\x01';
              goto LAB_002b32a3;
            }
            if (pcVar12 == (char *)0x0) {
              pcVar12 = pcVar9;
            }
            cVar1 = '\x01';
          }
          pcVar9 = pcVar9 + 1;
        } while (cVar1 != '\0');
        pcVar9 = local_1b8[0].buffer.ptr;
        iVar5 = 0;
        if (local_1b8[0].buffer.ptr != (char *)0x0 && *status < U_ILLEGAL_ARGUMENT_ERROR) {
          iVar5 = 0;
          pcVar12 = local_1b8[0].buffer.ptr;
          do {
            if (iVar5 < (int)local_260) {
              local_248[iVar5] = '-';
            }
            iVar21 = iVar5 + 1;
            pcVar16 = *(char **)pcVar12;
            sVar8 = strlen(pcVar16);
            if ((int)local_260 - iVar21 != 0 && iVar21 <= (int)local_260) {
              iVar5 = uprv_min_63((int)sVar8,(int)local_260 - iVar21);
              memcpy(local_248 + iVar21,pcVar16,(long)iVar5);
            }
            iVar5 = iVar21 + (int)sVar8;
            pcVar12 = *(char **)(pcVar12 + 8);
          } while (pcVar12 != (char *)0x0);
        }
LAB_002b35d1:
        while (pcVar9 != (char *)0x0) {
          pcVar12 = *(char **)(pcVar9 + 8);
          uprv_free_63(pcVar9);
          pcVar9 = pcVar12;
        }
        local_204 = 0;
        if (U_ZERO_ERROR < *status) goto LAB_002b3608;
      }
      u_terminateChars_63(local_248,(int)local_260,iVar5,status);
      local_204 = iVar5;
    }
    else {
      if (strict != '\0') {
        *status = U_ILLEGAL_ARGUMENT_ERROR;
      }
      local_238 = 0;
      local_204 = 0;
    }
  }
LAB_002b3608:
  pcVar9 = local_118.buffer.ptr;
  local_88 = 0;
  uStack_80 = 0;
  local_98 = 0;
  uStack_90 = 0;
  local_a8 = 0;
  uStack_a0 = 0;
  local_b8 = 0;
  uStack_b0 = 0;
  local_c8 = 0;
  uStack_c0 = 0;
  local_d8 = 0;
  uStack_d0 = 0;
  local_78 = 0;
  local_220 = uloc_openKeywords_63(local_118.buffer.ptr,status);
  local_204 = local_204 + iVar18;
  if (((char)local_238 == '\0') && (U_ZERO_ERROR < *status)) {
    uenum_close_63(local_220);
LAB_002b3e32:
    iVar5 = 0;
  }
  else {
    local_248 = local_230 + local_204;
    local_260 = (char *)CONCAT44(local_260._4_4_,langtagCapacity - local_204);
    iVar5 = 0;
    if ((char)local_238 != '\0' || local_220 != (UEnumeration *)0x0) {
      local_218 = (ExtensionListEntry *)0x0;
      local_210 = (AttributeListEntry *)0x0;
      local_1f0.status = U_ZERO_ERROR;
      icu_63::UVector::UVector
                (&local_1f0.pool,anon_unknown.dwarf_2c8aa5::CharStringPool::deleter,
                 (UElementsAreEqual *)0x0,&local_1f0.status);
      local_254 = U_ZERO_ERROR;
      local_240 = (char *)0x0;
      local_250 = (AttributeListEntry *)0x0;
LAB_002b3712:
      icu_63::MaybeStackArray<char,_40>::MaybeStackArray(&local_1b8[0].buffer);
      local_1b8[0].len = 0;
      *local_1b8[0].buffer.ptr = '\0';
      pAVar11 = (AttributeListEntry *)uenum_next_63(local_220,(int32_t *)0x0,status);
      if (pAVar11 != (AttributeListEntry *)0x0) {
        local_224 = 100;
        while (pcVar12 = icu_63::CharString::getAppendBuffer
                                   (local_1b8,local_224,local_224,&local_224,&local_254),
              local_254 < U_ILLEGAL_ARGUMENT_ERROR) {
          iVar5 = uloc_getKeywordValue_63(pcVar9,(char *)pAVar11,pcVar12,local_224,&local_254);
          if (local_254 != U_BUFFER_OVERFLOW_ERROR) {
            if (local_254 < U_ILLEGAL_ARGUMENT_ERROR) {
              icu_63::CharString::append(local_1b8,pcVar12,iVar5,&local_254);
              if (local_254 == U_STRING_NOT_TERMINATED_WARNING) {
                local_254 = U_ZERO_ERROR;
              }
              sVar8 = strlen((char *)pAVar11);
              iVar21 = strcmp((char *)pAVar11,"attribute");
              if (iVar21 == 0) {
                if (iVar5 < 1) goto LAB_002b3b39;
                local_250 = (AttributeListEntry *)((ulong)local_250 & 0xffffffff00000000);
                goto LAB_002b390b;
              }
              if ((int32_t)sVar8 < 2) {
                if (*(char *)&pAVar11->attribute == 'x') {
                  cVar1 = _isPrivateuseValueSubtags(local_1b8[0].buffer.ptr,iVar5);
                  goto LAB_002b3a0b;
                }
                UVar3 = _isExtensionSingleton((char *)pAVar11,(int32_t)sVar8);
                if (UVar3 == '\0') goto LAB_002b3b7e;
                local_200 = local_1b8[0].buffer.ptr;
                iVar6 = iVar5;
                if (iVar5 < 0) {
                  sVar8 = strlen(local_1b8[0].buffer.ptr);
                  iVar6 = (int32_t)sVar8;
                }
                if (iVar6 < 1) goto LAB_002b3b7e;
                local_1f8 = (long)iVar6;
                s_00 = (char *)0x0;
                pcVar16 = local_200;
                lVar15 = local_1f8;
                pcVar12 = local_200;
                goto LAB_002b3aaf;
              }
              local_250 = (AttributeListEntry *)uloc_toUnicodeLocaleKey_63((char *)pAVar11);
              if (local_250 == (AttributeListEntry *)0x0) {
                if (strict != '\0') goto LAB_002b3bc1;
                local_250 = (AttributeListEntry *)0x0;
                goto LAB_002b37cb;
              }
              local_240 = uloc_toUnicodeLocaleType_63((char *)pAVar11,local_1b8[0].buffer.ptr);
              if (local_240 == (char *)0x0) {
                if (strict != '\0') goto LAB_002b3bc1;
                local_240 = (char *)0x0;
                goto LAB_002b37cb;
              }
              if (local_240 != local_1b8[0].buffer.ptr) goto LAB_002b3b39;
              pCVar13 = anon_unknown.dwarf_2c8aa5::CharStringPool::create(&local_1f0);
              if (pCVar13 == (CharString *)0x0) goto LAB_002b3bb5;
              sVar8 = strlen(local_240);
              iVar5 = (int32_t)sVar8;
              pcVar12 = icu_63::CharString::getAppendBuffer
                                  (pCVar13,iVar5,iVar5,&local_1bc,&local_254);
              if (U_ZERO_ERROR < local_254) goto LAB_002b40f5;
              strcpy(pcVar12,local_240);
              T_CString_toLowerCase_63(pcVar12);
              icu_63::CharString::append(pCVar13,pcVar12,iVar5,&local_254);
              if (U_ZERO_ERROR < local_254) goto LAB_002b40f5;
              local_240 = (pCVar13->buffer).ptr;
              goto LAB_002b3b39;
            }
            break;
          }
          local_254 = U_ZERO_ERROR;
          local_224 = iVar5;
        }
        if (local_254 == U_MEMORY_ALLOCATION_ERROR) goto LAB_002b3bb5;
        if (strict != '\0') goto LAB_002b3bc1;
        local_254 = U_ZERO_ERROR;
        goto LAB_002b37cb;
      }
LAB_002b3bcb:
      icu_63::MaybeStackArray<char,_40>::~MaybeStackArray(&local_1b8[0].buffer);
      if ((char)local_238 == '\0') {
LAB_002b3c28:
        pEVar14 = local_218;
        iVar5 = 0;
        if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
          if (local_218 == (ExtensionListEntry *)0x0) {
            iVar5 = 0;
            pEVar14 = (ExtensionListEntry *)0x0;
          }
          else {
            local_238 = local_238 & 0xffffffff00000000;
            local_250 = local_210;
            iVar5 = 0;
            pAVar11 = local_210;
            pEVar19 = local_218;
            do {
              pcVar9 = pEVar19->key;
              bVar24 = (char)local_238 == '\0';
              local_238 = CONCAT44(local_238._4_4_,(int)CONCAT71((int7)((ulong)pAVar11 >> 8),1));
              if (bVar24) {
                sVar8 = strlen(pcVar9);
                if (sVar8 < 2) {
                  local_238 = local_238 & 0xffffffff00000000;
                }
                else {
                  if (iVar5 < (int)local_260) {
                    local_248[iVar5] = '-';
                  }
                  lVar15 = (long)iVar5 + 1;
                  if ((int)lVar15 < (int)local_260) {
                    local_248[lVar15] = 'u';
                  }
                  iVar5 = iVar5 + 2;
                  pcVar9 = pEVar19->key;
                }
              }
              uVar4 = strcmp(pcVar9,"attribute");
              pAVar11 = (AttributeListEntry *)(ulong)uVar4;
              pAVar23 = local_250;
              if (uVar4 == 0) {
                for (; pAVar23 != (AttributeListEntry *)0x0; pAVar23 = pAVar23->next) {
                  if (iVar5 < (int)local_260) {
                    local_248[iVar5] = '-';
                  }
                  iVar21 = iVar5 + 1;
                  pcVar9 = pAVar23->attribute;
                  pAVar11 = (AttributeListEntry *)strlen(pcVar9);
                  iVar18 = (int)pAVar11;
                  if ((int)local_260 - iVar21 != 0 && iVar21 <= (int)local_260) {
                    iVar5 = uprv_min_63(iVar18,(int)local_260 - iVar21);
                    pAVar11 = (AttributeListEntry *)memcpy(local_248 + iVar21,pcVar9,(long)iVar5);
                  }
                  iVar5 = iVar21 + iVar18;
                }
              }
              else {
                if (iVar5 < (int)local_260) {
                  local_248[iVar5] = '-';
                  pcVar9 = pEVar19->key;
                }
                iVar21 = iVar5 + 1;
                sVar8 = strlen(pcVar9);
                if ((int)local_260 - iVar21 != 0 && iVar21 <= (int)local_260) {
                  iVar5 = uprv_min_63((int)sVar8,(int)local_260 - iVar21);
                  memcpy(local_248 + iVar21,pcVar9,(long)iVar5);
                }
                iVar21 = iVar21 + (int)sVar8;
                if (iVar21 < (int)local_260) {
                  local_248[iVar21] = '-';
                }
                iVar21 = iVar21 + 1;
                pcVar9 = pEVar19->value;
                pAVar11 = (AttributeListEntry *)strlen(pcVar9);
                iVar18 = (int)pAVar11;
                if ((int)local_260 - iVar21 != 0 && iVar21 <= (int)local_260) {
                  iVar5 = uprv_min_63(iVar18,(int)local_260 - iVar21);
                  pAVar11 = (AttributeListEntry *)memcpy(local_248 + iVar21,pcVar9,(long)iVar5);
                }
                iVar5 = iVar21 + iVar18;
              }
              pEVar19 = pEVar19->next;
            } while (pEVar19 != (ExtensionListEntry *)0x0);
          }
        }
      }
      else {
        pEVar14 = (ExtensionListEntry *)uprv_malloc_63(0x18);
        if (pEVar14 != (ExtensionListEntry *)0x0) {
          pEVar14->key = "va";
          pEVar14->value = "posix";
          UVar3 = _addExtensionToList(&local_218,pEVar14,'\x01');
          if (UVar3 == '\0') {
            uprv_free_63(pEVar14);
          }
          goto LAB_002b3c28;
        }
        *status = U_MEMORY_ALLOCATION_ERROR;
        iVar5 = 0;
        pEVar14 = local_218;
      }
      while (pAVar11 = local_210, pEVar14 != (ExtensionListEntry *)0x0) {
        pEVar19 = pEVar14->next;
        uprv_free_63(pEVar14);
        pEVar14 = pEVar19;
      }
      while (pAVar11 != (AttributeListEntry *)0x0) {
        pAVar23 = pAVar11->next;
        uprv_free_63(pAVar11->attribute);
        uprv_free_63(pAVar11);
        pAVar11 = pAVar23;
      }
      uenum_close_63(local_220);
      UVar7 = *status;
      icu_63::UVector::~UVector(&local_1f0.pool);
      if (U_ZERO_ERROR < UVar7) goto LAB_002b3e32;
    }
    iVar5 = u_terminateChars_63(local_248,(int)local_260,iVar5,status);
  }
  iVar18 = iVar5 + local_204;
  local_1f0.status = U_ZERO_ERROR;
  iVar21 = 0;
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    pcVar9 = (char *)&local_d8;
    iVar5 = uloc_getVariant_63(local_118.buffer.ptr,pcVar9,0x9d,&local_1f0.status);
    if (local_1f0.status < U_ILLEGAL_ARGUMENT_ERROR &&
        local_1f0.status != U_STRING_NOT_TERMINATED_WARNING) {
      destCapacity = langtagCapacity - iVar18;
      if (iVar5 < 1) {
        bVar24 = *status < U_ILLEGAL_ARGUMENT_ERROR;
        iVar21 = 0;
      }
      else {
        local_260 = (char *)CONCAT44(local_260._4_4_,iVar18);
        pcVar12 = (char *)0x0;
        bVar24 = true;
        iVar20 = 0;
        do {
          cVar1 = *pcVar9;
          if (cVar1 == '\0') {
LAB_002b3efd:
            if (pcVar12 != (char *)0x0) {
              cVar2 = *pcVar12;
              pcVar16 = pcVar12;
              while (cVar2 != '\0') {
                cVar2 = uprv_asciitolower_63(cVar2);
                *pcVar16 = cVar2;
                cVar2 = pcVar16[1];
                pcVar16 = pcVar16 + 1;
              }
              UVar3 = _isPrivateuseValueSubtag(pcVar12,-1);
              if (UVar3 == '\0') {
                if (strict != '\0') goto LAB_002b3eb0;
                break;
              }
              if ((!bVar24) || (UVar3 = _isVariantSubtag(pcVar12,-1), UVar3 == '\0')) {
                if (iVar20 < destCapacity) {
                  lVar15 = (long)iVar20;
                  iVar20 = iVar20 + 1;
                  local_1b8[0].buffer.stackArray[lVar15 + -0xd] = '-';
                }
                iVar21 = iVar20;
                if (bVar24) {
                  if (iVar20 < destCapacity) {
                    lVar15 = (long)iVar20;
                    iVar20 = iVar20 + 1;
                    local_1b8[0].buffer.stackArray[lVar15 + -0xd] = 'x';
                  }
                  if (iVar20 < destCapacity) {
                    lVar15 = (long)iVar20;
                    iVar20 = iVar20 + 1;
                    local_1b8[0].buffer.stackArray[lVar15 + -0xd] = '-';
                  }
                  if (destCapacity - iVar20 != 0 && iVar20 <= destCapacity) {
                    iVar5 = uprv_min_63(8,destCapacity - iVar20);
                    memcpy(local_1b8[0].buffer.stackArray + (long)iVar20 + -0xd,"lvariant",
                           (long)iVar5);
                  }
                  iVar21 = iVar20 + 8;
                  if (iVar20 + 8 < destCapacity) {
                    iVar21 = iVar20 + 9;
                    local_1b8[0].buffer.stackArray[(long)iVar20 + -5] = '-';
                  }
                }
                sVar8 = strlen(pcVar12);
                if (destCapacity - iVar21 != 0 && iVar21 <= destCapacity) {
                  iVar5 = uprv_min_63((int)sVar8,destCapacity - iVar21);
                  memcpy(local_1b8[0].buffer.stackArray + (long)iVar21 + -0xd,pcVar12,(long)iVar5);
                }
                iVar20 = iVar21 + (int)sVar8;
                pcVar12 = (char *)0x0;
                bVar24 = false;
                goto LAB_002b402d;
              }
            }
            pcVar12 = (char *)0x0;
          }
          else {
            if ((cVar1 == '_') || (cVar1 == '-')) {
              *pcVar9 = '\0';
              cVar1 = '\x01';
              goto LAB_002b3efd;
            }
            if (pcVar12 == (char *)0x0) {
              pcVar12 = pcVar9;
            }
            cVar1 = '\x01';
          }
LAB_002b402d:
          pcVar9 = pcVar9 + 1;
        } while (cVar1 != '\0');
        iVar21 = 0;
        iVar18 = (int)local_260;
        if (U_ZERO_ERROR < *status) goto LAB_002b409f;
        bVar24 = true;
        iVar21 = iVar20;
      }
      local_230 = local_230 + iVar18;
      if ((bVar24) && (destCapacity - iVar21 != 0 && iVar21 <= destCapacity)) {
        iVar5 = uprv_min_63(iVar21,destCapacity - iVar21);
        memcpy(local_230,local_1b8,(long)iVar5);
      }
      u_terminateChars_63(local_230,destCapacity,iVar21,status);
    }
    else {
      local_260 = (char *)CONCAT44(local_260._4_4_,iVar18);
      if (strict != '\0') {
LAB_002b3eb0:
        *status = U_ILLEGAL_ARGUMENT_ERROR;
      }
      iVar21 = 0;
      iVar18 = (int)local_260;
    }
  }
LAB_002b409f:
  iVar21 = iVar21 + iVar18;
LAB_002b40a1:
  icu_63::MaybeStackArray<char,_40>::~MaybeStackArray(&local_118.buffer);
  return iVar21;
  while( true ) {
    uprv_free_63(pAVar11);
    uprv_free_63(pcVar12);
    if (strict != '\0') break;
LAB_002b390b:
    do {
      uVar22 = (ulong)(uint)(iVar5 - (int)local_250);
      if (iVar5 - (int)local_250 == 0 || iVar5 < (int)local_250) {
LAB_002b3969:
        s = 1;
        if (iVar5 <= (int)local_250) goto LAB_002b3b24;
      }
      else {
        iVar21 = 0;
        uVar17 = 0;
        do {
          if (local_1b8[0].buffer.ptr[uVar17 + (long)(int)local_250] == '-') {
            local_250._0_4_ = ((int)local_250 - iVar21) + 1;
            uVar22 = (ulong)(uint)-iVar21;
            goto LAB_002b3957;
          }
          *(char *)((long)&local_d8 + uVar17) =
               local_1b8[0].buffer.ptr[uVar17 + (long)(int)local_250];
          uVar17 = uVar17 + 1;
          iVar21 = iVar21 + -1;
        } while (uVar22 != uVar17);
        local_250._0_4_ = (int)local_250 - iVar21;
LAB_002b3957:
        if ((int)uVar22 == 0) goto LAB_002b3969;
        *(undefined1 *)((long)&local_d8 + uVar22) = 0;
        s = (size_t)((int)uVar22 + 1);
      }
      pAVar11 = (AttributeListEntry *)uprv_malloc_63(0x10);
      if ((pAVar11 == (AttributeListEntry *)0x0) ||
         (pcVar12 = (char *)uprv_malloc_63(s), pcVar12 == (char *)0x0)) {
        *status = U_MEMORY_ALLOCATION_ERROR;
        goto LAB_002b3b24;
      }
      strcpy(pcVar12,(char *)&local_d8);
      pAVar11->attribute = pcVar12;
      UVar3 = _addAttributeToList(&local_210,pAVar11);
    } while (UVar3 != '\0');
  }
  *status = U_ILLEGAL_ARGUMENT_ERROR;
LAB_002b3b24:
  local_240 = (char *)0x0;
  local_250 = (AttributeListEntry *)0x3362fa;
LAB_002b3b39:
  pEVar14 = (ExtensionListEntry *)uprv_malloc_63(0x18);
  if (pEVar14 == (ExtensionListEntry *)0x0) {
LAB_002b3bb5:
    *status = U_MEMORY_ALLOCATION_ERROR;
    goto LAB_002b3bcb;
  }
  pEVar14->key = (char *)local_250;
  pEVar14->value = local_240;
  UVar3 = _addExtensionToList(&local_218,pEVar14,'\x01');
  if (UVar3 == '\0') {
    uprv_free_63(pEVar14);
LAB_002b3b7e:
    if (strict != '\0') {
LAB_002b3bc1:
      *status = U_ILLEGAL_ARGUMENT_ERROR;
      goto LAB_002b3bcb;
    }
  }
LAB_002b37cb:
  icu_63::MaybeStackArray<char,_40>::~MaybeStackArray(&local_1b8[0].buffer);
  goto LAB_002b3712;
LAB_002b3aaf:
  do {
    if (*pcVar12 == '-') {
      if ((s_00 != (char *)0x0) &&
         (UVar3 = _isExtensionSubtag(s_00,(int)pcVar12 - (int)s_00), UVar3 != '\0')) break;
      goto LAB_002b3b7e;
    }
    if (s_00 == (char *)0x0) {
      s_00 = pcVar12;
    }
    pcVar12 = pcVar12 + 1;
    if (lVar15 <= (long)pcVar12 - (long)pcVar16) {
      cVar1 = _isExtensionSubtag(s_00,(int)pcVar12 - (int)s_00);
LAB_002b3a0b:
      if (cVar1 == '\0') goto LAB_002b3b7e;
      pCVar13 = anon_unknown.dwarf_2c8aa5::CharStringPool::create(&local_1f0);
      if (pCVar13 == (CharString *)0x0) goto LAB_002b3bb5;
      icu_63::CharString::append(pCVar13,local_1b8[0].buffer.ptr,iVar5,&local_254);
      if (local_254 < U_ILLEGAL_ARGUMENT_ERROR) {
        local_240 = (pCVar13->buffer).ptr;
        local_250 = pAVar11;
        goto LAB_002b3b39;
      }
LAB_002b40f5:
      *status = local_254;
      goto LAB_002b3bcb;
    }
  } while( true );
  pcVar12 = pcVar12 + 1;
  s_00 = (char *)0x0;
  pcVar16 = local_200;
  lVar15 = local_1f8;
  if (local_1f8 <= (long)pcVar12 - (long)local_200) goto LAB_002b3b7e;
  goto LAB_002b3aaf;
}

Assistant:

U_CAPI int32_t U_EXPORT2
uloc_toLanguageTag(const char* localeID,
                   char* langtag,
                   int32_t langtagCapacity,
                   UBool strict,
                   UErrorCode* status) {
    icu::CharString canonical;
    int32_t reslen;
    UErrorCode tmpStatus = U_ZERO_ERROR;
    UBool hadPosix = FALSE;
    const char* pKeywordStart;

    /* Note: uloc_canonicalize returns "en_US_POSIX" for input locale ID "".  See #6835 */
    int32_t resultCapacity = static_cast<int32_t>(uprv_strlen(localeID));
    if (resultCapacity > 0) {
        char* buffer;

        for (;;) {
            buffer = canonical.getAppendBuffer(
                    /*minCapacity=*/resultCapacity,
                    /*desiredCapacityHint=*/resultCapacity,
                    resultCapacity,
                    tmpStatus);

            if (U_FAILURE(tmpStatus)) {
                *status = tmpStatus;
                return 0;
            }

            reslen =
                uloc_canonicalize(localeID, buffer, resultCapacity, &tmpStatus);

            if (tmpStatus != U_BUFFER_OVERFLOW_ERROR) {
                break;
            }

            resultCapacity = reslen;
            tmpStatus = U_ZERO_ERROR;
        }

        if (U_FAILURE(tmpStatus)) {
            *status = U_ILLEGAL_ARGUMENT_ERROR;
            return 0;
        }

        canonical.append(buffer, reslen, tmpStatus);
        if (tmpStatus == U_STRING_NOT_TERMINATED_WARNING) {
            tmpStatus = U_ZERO_ERROR;  // Terminators provided by CharString.
        }

        if (U_FAILURE(tmpStatus)) {
            *status = tmpStatus;
            return 0;
        }
    }

    reslen = 0;

    /* For handling special case - private use only tag */
    pKeywordStart = locale_getKeywordsStart(canonical.data());
    if (pKeywordStart == canonical.data()) {
        UEnumeration *kwdEnum;
        int kwdCnt = 0;
        UBool done = FALSE;

        kwdEnum = uloc_openKeywords(canonical.data(), &tmpStatus);
        if (kwdEnum != NULL) {
            kwdCnt = uenum_count(kwdEnum, &tmpStatus);
            if (kwdCnt == 1) {
                const char *key;
                int32_t len = 0;

                key = uenum_next(kwdEnum, &len, &tmpStatus);
                if (len == 1 && *key == PRIVATEUSE) {
                    char buf[ULOC_KEYWORD_AND_VALUES_CAPACITY];
                    buf[0] = PRIVATEUSE;
                    buf[1] = SEP;
                    len = uloc_getKeywordValue(localeID, key, &buf[2], sizeof(buf) - 2, &tmpStatus);
                    if (U_SUCCESS(tmpStatus)) {
                        if (_isPrivateuseValueSubtags(&buf[2], len)) {
                            /* return private use only tag */
                            reslen = len + 2;
                            uprv_memcpy(langtag, buf, uprv_min(reslen, langtagCapacity));
                            u_terminateChars(langtag, langtagCapacity, reslen, status);
                            done = TRUE;
                        } else if (strict) {
                            *status = U_ILLEGAL_ARGUMENT_ERROR;
                            done = TRUE;
                        }
                        /* if not strict mode, then "und" will be returned */
                    } else {
                        *status = U_ILLEGAL_ARGUMENT_ERROR;
                        done = TRUE;
                    }
                }
            }
            uenum_close(kwdEnum);
            if (done) {
                return reslen;
            }
        }
    }

    reslen += _appendLanguageToLanguageTag(canonical.data(), langtag, langtagCapacity, strict, status);
    reslen += _appendScriptToLanguageTag(canonical.data(), langtag + reslen, langtagCapacity - reslen, strict, status);
    reslen += _appendRegionToLanguageTag(canonical.data(), langtag + reslen, langtagCapacity - reslen, strict, status);
    reslen += _appendVariantsToLanguageTag(canonical.data(), langtag + reslen, langtagCapacity - reslen, strict, &hadPosix, status);
    reslen += _appendKeywordsToLanguageTag(canonical.data(), langtag + reslen, langtagCapacity - reslen, strict, hadPosix, status);
    reslen += _appendPrivateuseToLanguageTag(canonical.data(), langtag + reslen, langtagCapacity - reslen, strict, hadPosix, status);

    return reslen;
}